

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raspicam_still_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  void *pvVar6;
  ulong uVar7;
  float fVar8;
  ofstream file;
  uchar *data;
  uint length;
  int iso;
  int height;
  int width;
  float in_stack_fffffffffffffd24;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  undefined8 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  allocator<char> *__a;
  char *in_stack_fffffffffffffd58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  allocator<char> local_99;
  string local_98 [32];
  int local_78;
  allocator<char> local_71;
  string local_70 [32];
  int local_50;
  allocator<char> local_39;
  string local_38 [36];
  int local_14;
  int local_4;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffd30 >> 0x20);
  local_4 = 0;
  usage();
  __a = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,__a);
  fVar8 = getParamVal((string *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),iVar3,
                      (char **)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                      in_stack_fffffffffffffd24);
  iVar1 = (int)fVar8;
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  local_14 = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,__a);
  fVar8 = getParamVal((string *)CONCAT44(iVar1,in_stack_fffffffffffffd38),iVar3,
                      (char **)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                      in_stack_fffffffffffffd24);
  iVar2 = (int)fVar8;
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  iVar3 = (int)((ulong)&local_99 >> 0x20);
  local_50 = iVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,__a);
  fVar8 = getParamVal((string *)CONCAT44(iVar1,fVar8),iVar3,
                      (char **)CONCAT44(iVar2,in_stack_fffffffffffffd28),in_stack_fffffffffffffd24);
  iVar3 = (int)fVar8;
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  local_78 = iVar3;
  poVar5 = std::operator<<((ostream *)&std::cout,"Initializing ...");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_14);
  poVar5 = std::operator<<(poVar5,"x");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_50);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  raspicam::RaspiCam_Still::setWidth(0x105178);
  raspicam::RaspiCam_Still::setHeight(0x105178);
  raspicam::RaspiCam_Still::setISO(0x105178);
  raspicam::RaspiCam_Still::setEncoding(0x105178);
  raspicam::RaspiCam_Still::open();
  poVar5 = std::operator<<((ostream *)&std::cout,"capture");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  uVar4 = raspicam::RaspiCam_Still::getImageBufferSize();
  pvVar6 = operator_new__((ulong)uVar4);
  uVar7 = raspicam::RaspiCam_Still::grab_retrieve((uchar *)&Camera,(uint)pvVar6);
  if ((uVar7 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in grab");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_4 = -1;
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"saving picture.bmp");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::ofstream::ofstream(&stack0xfffffffffffffd58,"picture.bmp",_S_bin);
    std::ostream::write(&stack0xfffffffffffffd58,(long)pvVar6);
    local_4 = 0;
    std::ofstream::~ofstream(&stack0xfffffffffffffd58);
  }
  return local_4;
}

Assistant:

int main ( int argc, char *argv[] ) {
    usage();

    int width = getParamVal ( "-w",argc,argv,2592 );
    int height =getParamVal ( "-h",argc,argv,1944 );
    int iso=getParamVal ( "-iso",argc,argv,400);


    cout << "Initializing ..."<<width<<"x"<<height<<endl;
    Camera.setWidth ( width );
    Camera.setHeight ( height );
    Camera.setISO(iso);
    Camera.setEncoding ( raspicam::RASPICAM_ENCODING_BMP );
    Camera.open();
    cout<<"capture"<<endl;
    unsigned int length = Camera.getImageBufferSize(); // Header + Image Data + Padding
    unsigned char * data = new unsigned char[length];
      if ( !Camera.grab_retrieve(data, length) ) {
        cerr<<"Error in grab"<<endl;
        return -1;
    }

    cout<<"saving picture.bmp"<<endl;
    ofstream file ( "picture.bmp",ios::binary );
    file.write ( ( char* ) data,   length );
    return 0;
}